

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_proxy(SessionHandle *data,connectdata *conn,char *proxy)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  ushort **ppuVar4;
  long lVar5;
  bool bVar6;
  byte *local_70;
  char *ptr;
  char *proxypasswd;
  char *proxyuser;
  char *pcStack_50;
  CURLcode res;
  char *atsign;
  char *portptr;
  char *proxyptr;
  char *endofprot;
  char *prox_portno;
  char *proxy_local;
  connectdata *conn_local;
  SessionHandle *data_local;
  
  prox_portno = proxy;
  proxy_local = (char *)conn;
  conn_local = (connectdata *)data;
  proxyptr = strstr(proxy,"://");
  if (proxyptr == (char *)0x0) {
    portptr = prox_portno;
  }
  else {
    portptr = proxyptr + 3;
    iVar1 = Curl_raw_nequal("socks5h",prox_portno,7);
    if (iVar1 == 0) {
      iVar1 = Curl_raw_nequal("socks5",prox_portno,6);
      if (iVar1 == 0) {
        iVar1 = Curl_raw_nequal("socks4a",prox_portno,7);
        if (iVar1 == 0) {
          iVar1 = Curl_raw_nequal("socks4",prox_portno,6);
          if ((iVar1 != 0) || (iVar1 = Curl_raw_nequal("socks",prox_portno,5), iVar1 != 0)) {
            proxy_local[0x1a0] = '\x04';
            proxy_local[0x1a1] = '\0';
            proxy_local[0x1a2] = '\0';
            proxy_local[0x1a3] = '\0';
          }
        }
        else {
          proxy_local[0x1a0] = '\x06';
          proxy_local[0x1a1] = '\0';
          proxy_local[0x1a2] = '\0';
          proxy_local[0x1a3] = '\0';
        }
      }
      else {
        proxy_local[0x1a0] = '\x05';
        proxy_local[0x1a1] = '\0';
        proxy_local[0x1a2] = '\0';
        proxy_local[0x1a3] = '\0';
      }
    }
    else {
      proxy_local[0x1a0] = '\a';
      proxy_local[0x1a1] = '\0';
      proxy_local[0x1a2] = '\0';
      proxy_local[0x1a3] = '\0';
    }
  }
  pcStack_50 = strchr(portptr,0x40);
  if (pcStack_50 != (char *)0x0) {
    proxyuser._4_4_ = 0;
    proxypasswd = (char *)0x0;
    ptr = (char *)0x0;
    proxyuser._4_4_ =
         parse_login_details(portptr,(long)pcStack_50 - (long)portptr,&proxypasswd,&ptr,(char **)0x0
                            );
    pcVar3 = portptr;
    if (proxyuser._4_4_ == CURLE_OK) {
      if (*(long *)(proxy_local + 400) != 0) {
        (*Curl_cfree)(*(void **)(proxy_local + 400));
        proxy_local[400] = '\0';
        proxy_local[0x191] = '\0';
        proxy_local[0x192] = '\0';
        proxy_local[0x193] = '\0';
        proxy_local[0x194] = '\0';
        proxy_local[0x195] = '\0';
        proxy_local[0x196] = '\0';
        proxy_local[0x197] = '\0';
      }
      if ((proxypasswd == (char *)0x0) || (sVar2 = strlen(proxypasswd), 0xff < sVar2)) {
        pcVar3 = (*Curl_cstrdup)("");
        *(char **)(proxy_local + 400) = pcVar3;
      }
      else {
        pcVar3 = curl_easy_unescape(conn_local,proxypasswd,0,(int *)0x0);
        *(char **)(proxy_local + 400) = pcVar3;
      }
      if (*(long *)(proxy_local + 400) == 0) {
        proxyuser._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        if (*(long *)(proxy_local + 0x198) != 0) {
          (*Curl_cfree)(*(void **)(proxy_local + 0x198));
          proxy_local[0x198] = '\0';
          proxy_local[0x199] = '\0';
          proxy_local[0x19a] = '\0';
          proxy_local[0x19b] = '\0';
          proxy_local[0x19c] = '\0';
          proxy_local[0x19d] = '\0';
          proxy_local[0x19e] = '\0';
          proxy_local[0x19f] = '\0';
        }
        if ((ptr == (char *)0x0) || (sVar2 = strlen(ptr), 0xff < sVar2)) {
          pcVar3 = (*Curl_cstrdup)("");
          *(char **)(proxy_local + 0x198) = pcVar3;
        }
        else {
          pcVar3 = curl_easy_unescape(conn_local,ptr,0,(int *)0x0);
          *(char **)(proxy_local + 0x198) = pcVar3;
        }
        if (*(long *)(proxy_local + 0x198) == 0) {
          proxyuser._4_4_ = CURLE_OUT_OF_MEMORY;
        }
      }
      pcVar3 = portptr;
      if (proxyuser._4_4_ == CURLE_OK) {
        proxy_local[0x28d] = '\x01';
        pcStack_50 = pcStack_50 + 1;
        pcVar3 = pcStack_50;
        if (pcStack_50 == (char *)0x0) {
          proxyuser._4_4_ = CURLE_OUT_OF_MEMORY;
          pcVar3 = portptr;
        }
      }
    }
    portptr = pcVar3;
    if (proxypasswd != (char *)0x0) {
      (*Curl_cfree)(proxypasswd);
      proxypasswd = (char *)0x0;
    }
    if (ptr != (char *)0x0) {
      (*Curl_cfree)(ptr);
      ptr = (char *)0x0;
    }
    if (proxyuser._4_4_ != CURLE_OK) {
      return proxyuser._4_4_;
    }
  }
  atsign = portptr;
  if (*portptr == '[') {
    local_70 = (byte *)(portptr + 1);
    portptr = (char *)local_70;
    while( true ) {
      bVar6 = false;
      if (*local_70 != 0) {
        ppuVar4 = __ctype_b_loc();
        bVar6 = true;
        if ((((*ppuVar4)[(int)(uint)*local_70] & 0x1000) == 0) && (bVar6 = true, *local_70 != 0x3a))
        {
          bVar6 = *local_70 == 0x2e;
        }
      }
      if (!bVar6) break;
      local_70 = local_70 + 1;
    }
    if (*local_70 == 0x25) {
      iVar1 = strncmp("%25",(char *)local_70,3);
      if (iVar1 != 0) {
        Curl_infof((SessionHandle *)conn_local,"Please URL encode %% as %%25, see RFC 6874.\n");
      }
      do {
        local_70 = local_70 + 1;
        bVar6 = false;
        if (*local_70 != 0) {
          ppuVar4 = __ctype_b_loc();
          bVar6 = true;
          if (((*ppuVar4)[(int)(uint)*local_70] & 0x400) == 0) {
            ppuVar4 = __ctype_b_loc();
            bVar6 = true;
            if ((((((*ppuVar4)[(int)(uint)*local_70] & 0x1000) == 0) &&
                 (bVar6 = true, *local_70 != 0x2d)) && (bVar6 = true, *local_70 != 0x2e)) &&
               (bVar6 = true, *local_70 != 0x5f)) {
              bVar6 = *local_70 == 0x7e;
            }
          }
        }
      } while (bVar6);
    }
    if (*local_70 == 0x5d) {
      *local_70 = 0;
      local_70 = local_70 + 1;
    }
    else {
      Curl_infof((SessionHandle *)conn_local,"Invalid IPv6 address format\n");
    }
    atsign = (char *)local_70;
  }
  endofprot = strchr(atsign,0x3a);
  if (endofprot == (char *)0x0) {
    if (*portptr == '/') {
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
    pcStack_50 = strchr(portptr,0x2f);
    if (pcStack_50 != (char *)0x0) {
      *pcStack_50 = '\0';
    }
    if ((conn_local->created).tv_usec != 0) {
      *(__suseconds_t *)(proxy_local + 0xf0) = (conn_local->created).tv_usec;
    }
  }
  else {
    *endofprot = '\0';
    endofprot = endofprot + 1;
    lVar5 = strtol(endofprot,(char **)0x0,10);
    *(long *)(proxy_local + 0xf0) = lVar5;
  }
  pcVar3 = (*Curl_cstrdup)(portptr);
  *(char **)(proxy_local + 0xd0) = pcVar3;
  *(undefined8 *)(proxy_local + 0xe0) = *(undefined8 *)(proxy_local + 0xd0);
  if (*(long *)(proxy_local + 0xd0) == 0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode parse_proxy(struct SessionHandle *data,
                            struct connectdata *conn, char *proxy)
{
  char *prox_portno;
  char *endofprot;

  /* We use 'proxyptr' to point to the proxy name from now on... */
  char *proxyptr;
  char *portptr;
  char *atsign;

  /* We do the proxy host string parsing here. We want the host name and the
   * port name. Accept a protocol:// prefix
   */

  /* Parse the protocol part if present */
  endofprot = strstr(proxy, "://");
  if(endofprot) {
    proxyptr = endofprot+3;
    if(checkprefix("socks5h", proxy))
      conn->proxytype = CURLPROXY_SOCKS5_HOSTNAME;
    else if(checkprefix("socks5", proxy))
      conn->proxytype = CURLPROXY_SOCKS5;
    else if(checkprefix("socks4a", proxy))
      conn->proxytype = CURLPROXY_SOCKS4A;
    else if(checkprefix("socks4", proxy) || checkprefix("socks", proxy))
      conn->proxytype = CURLPROXY_SOCKS4;
    /* Any other xxx:// : change to http proxy */
  }
  else
    proxyptr = proxy; /* No xxx:// head: It's a HTTP proxy */

  /* Is there a username and password given in this proxy url? */
  atsign = strchr(proxyptr, '@');
  if(atsign) {
    CURLcode res = CURLE_OK;
    char *proxyuser = NULL;
    char *proxypasswd = NULL;

    res = parse_login_details(proxyptr, atsign - proxyptr,
                              &proxyuser, &proxypasswd, NULL);
    if(!res) {
      /* found user and password, rip them out.  note that we are
         unescaping them, as there is otherwise no way to have a
         username or password with reserved characters like ':' in
         them. */
      Curl_safefree(conn->proxyuser);
      if(proxyuser && strlen(proxyuser) < MAX_CURL_USER_LENGTH)
        conn->proxyuser = curl_easy_unescape(data, proxyuser, 0, NULL);
      else
        conn->proxyuser = strdup("");

      if(!conn->proxyuser)
        res = CURLE_OUT_OF_MEMORY;
      else {
        Curl_safefree(conn->proxypasswd);
        if(proxypasswd && strlen(proxypasswd) < MAX_CURL_PASSWORD_LENGTH)
          conn->proxypasswd = curl_easy_unescape(data, proxypasswd, 0, NULL);
        else
          conn->proxypasswd = strdup("");

        if(!conn->proxypasswd)
          res = CURLE_OUT_OF_MEMORY;
      }

      if(!res) {
        conn->bits.proxy_user_passwd = TRUE; /* enable it */
        atsign++; /* the right side of the @-letter */

        if(atsign)
          proxyptr = atsign; /* now use this instead */
        else
          res = CURLE_OUT_OF_MEMORY;
      }
    }

    Curl_safefree(proxyuser);
    Curl_safefree(proxypasswd);

    if(res)
      return res;
  }

  /* start scanning for port number at this point */
  portptr = proxyptr;

  /* detect and extract RFC6874-style IPv6-addresses */
  if(*proxyptr == '[') {
    char *ptr = ++proxyptr; /* advance beyond the initial bracket */
    while(*ptr && (ISXDIGIT(*ptr) || (*ptr == ':') || (*ptr == '.')))
      ptr++;
    if(*ptr == '%') {
      /* There might be a zone identifier */
      if(strncmp("%25", ptr, 3))
        infof(data, "Please URL encode %% as %%25, see RFC 6874.\n");
      ptr++;
      /* Allow unresered characters as defined in RFC 3986 */
      while(*ptr && (ISALPHA(*ptr) || ISXDIGIT(*ptr) || (*ptr == '-') ||
                     (*ptr == '.') || (*ptr == '_') || (*ptr == '~')))
        ptr++;
    }
    if(*ptr == ']')
      /* yeps, it ended nicely with a bracket as well */
      *ptr++ = 0;
    else
      infof(data, "Invalid IPv6 address format\n");
    portptr = ptr;
    /* Note that if this didn't end with a bracket, we still advanced the
     * proxyptr first, but I can't see anything wrong with that as no host
     * name nor a numeric can legally start with a bracket.
     */
  }

  /* Get port number off proxy.server.com:1080 */
  prox_portno = strchr(portptr, ':');
  if(prox_portno) {
    *prox_portno = 0x0; /* cut off number from host name */
    prox_portno ++;
    /* now set the local port number */
    conn->port = strtol(prox_portno, NULL, 10);
  }
  else {
    if(proxyptr[0]=='/')
      /* If the first character in the proxy string is a slash, fail
         immediately. The following code will otherwise clear the string which
         will lead to code running as if no proxy was set! */
      return CURLE_COULDNT_RESOLVE_PROXY;

    /* without a port number after the host name, some people seem to use
       a slash so we strip everything from the first slash */
    atsign = strchr(proxyptr, '/');
    if(atsign)
      *atsign = 0x0; /* cut off path part from host name */

    if(data->set.proxyport)
      /* None given in the proxy string, then get the default one if it is
         given */
      conn->port = data->set.proxyport;
  }

  /* now, clone the cleaned proxy host name */
  conn->proxy.rawalloc = strdup(proxyptr);
  conn->proxy.name = conn->proxy.rawalloc;

  if(!conn->proxy.rawalloc)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}